

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_xbm.c
# Opt level: O3

gdImagePtr gdImageCreateFromXbm(FILE *fd)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  gdImagePtr im;
  int iVar6;
  int iVar7;
  uint uVar8;
  FILE *pFVar9;
  int iVar10;
  char h [8];
  uint b;
  int value;
  char fline [255];
  char iname [255];
  int local_25c;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_24e;
  undefined1 local_24d;
  undefined1 local_24c;
  FILE *local_248;
  uint local_240;
  int local_23c;
  char local_238 [254];
  undefined1 local_13a;
  char local_138 [264];
  
  rewind((FILE *)fd);
  pcVar3 = fgets(local_238,0xff,(FILE *)fd);
  if (pcVar3 != (char *)0x0) {
    iVar7 = 0;
    iVar6 = 0;
    iVar10 = 0;
    local_25c = 0;
    local_248 = (FILE *)fd;
    do {
      local_13a = 0;
      sVar4 = strlen(local_238);
      if (sVar4 == 0xfe) {
        return (gdImagePtr)0x0;
      }
      iVar1 = __isoc99_sscanf(local_238,"#define %s %d",local_138,&local_23c);
      if (iVar1 == 2) {
        pcVar5 = strrchr(local_138,0x5f);
        pcVar3 = pcVar5 + 1;
        if (pcVar5 == (char *)0x0) {
          pcVar3 = local_138;
        }
        iVar2 = strcmp("width",pcVar3);
        iVar1 = local_23c;
        if (iVar2 == 0) {
          local_25c = local_23c;
        }
        iVar2 = strcmp("height",pcVar3);
        if (iVar2 == 0) {
          iVar10 = iVar1;
        }
      }
      else {
        iVar2 = __isoc99_sscanf(local_238,"static unsigned char %s = {",local_138);
        iVar1 = 0x80;
        if ((iVar2 != 1) &&
           (iVar2 = __isoc99_sscanf(local_238,"static char %s = {",local_138), iVar2 != 1)) {
          iVar2 = __isoc99_sscanf(local_238,"static unsigned short %s = {",local_138);
          iVar1 = 0x8000;
          if ((iVar2 != 1) &&
             ((iVar2 = __isoc99_sscanf(local_238,"static short %s = {",local_138), iVar2 != 1 &&
              (iVar1 = iVar6, iVar6 == 0)))) {
            iVar6 = 0;
            goto LAB_00125cae;
          }
        }
        iVar6 = iVar1;
        iVar7 = ((uint)(iVar10 * local_25c) >> 3) + 1;
        pcVar5 = strrchr(local_138,0x5f);
        pcVar3 = pcVar5 + 1;
        if (pcVar5 == (char *)0x0) {
          pcVar3 = local_138;
        }
        iVar1 = strcmp("bits[]",pcVar3);
        pFVar9 = local_248;
        if (iVar1 == 0) break;
      }
LAB_00125cae:
      pFVar9 = local_248;
      pcVar3 = fgets(local_238,0xff,local_248);
    } while (pcVar3 != (char *)0x0);
    if ((iVar6 != 0 && iVar7 != 0) && (im = gdImageCreate(local_25c,iVar10), im != (gdImagePtr)0x0))
    {
      gdImageColorAllocate(im,0xff,0xff,0xff);
      gdImageColorAllocate(im,0,0,0);
      local_24e = 0;
      local_24c = 0;
      if (iVar7 != 0) {
        iVar1 = 0;
        iVar10 = 0;
        local_25c = 0;
        do {
          do {
            iVar2 = getc(pFVar9);
            if (iVar2 == -1) goto LAB_00125e65;
          } while (iVar2 != 0x78);
          iVar2 = getc(pFVar9);
          if (iVar2 == -1) break;
          local_250 = (undefined1)iVar2;
          iVar2 = getc(pFVar9);
          if (iVar2 == -1) break;
          local_24f = (undefined1)iVar2;
          if (iVar6 == 0x8000) {
            iVar2 = getc(pFVar9);
            if (iVar2 == -1) break;
            local_24e = (undefined1)iVar2;
            iVar2 = getc(pFVar9);
            if (iVar2 == -1) break;
            local_24d = (undefined1)iVar2;
            __isoc99_sscanf(&local_250,"%x",&local_240);
LAB_00125df6:
            uVar8 = 1;
            iVar2 = iVar10;
            do {
              iVar10 = iVar2 + 1;
              gdImageSetPixel(im,iVar2,iVar1,(uint)((local_240 & uVar8) != 0));
              pFVar9 = local_248;
              if (iVar10 == im->sx) {
                iVar1 = iVar1 + 1;
                iVar10 = 0;
                if (iVar1 == im->sy) {
                  return im;
                }
                break;
              }
              uVar8 = uVar8 * 2;
              iVar2 = iVar10;
            } while ((int)uVar8 <= iVar6);
          }
          else {
            __isoc99_sscanf(&local_250,"%x",&local_240);
            if (iVar6 != 0) goto LAB_00125df6;
          }
          local_25c = local_25c + 1;
        } while (local_25c != iVar7);
      }
LAB_00125e65:
      gd_error("EOF before image was complete");
      gdImageDestroy(im);
    }
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromXbm(FILE * fd)
{
	char fline[MAX_XBM_LINE_SIZE];
	char iname[MAX_XBM_LINE_SIZE];
	char *type;
	int value;
	unsigned int width = 0, height = 0;
	int fail = 0;
	int max_bit = 0;

	gdImagePtr im;
	int bytes = 0, i;
	int bit, x = 0, y = 0;
	int ch;
	char h[8];
	unsigned int b;

	rewind(fd);
	while (fgets(fline, MAX_XBM_LINE_SIZE, fd)) {
		fline[MAX_XBM_LINE_SIZE-1] = '\0';
		if (strlen(fline) == MAX_XBM_LINE_SIZE-1) {
			return 0;
		}
		if (sscanf(fline, "#define %s %d", iname, &value) == 2) {
			if (!(type = strrchr(iname, '_'))) {
				type = iname;
			} else {
				type++;
			}

			if (!strcmp("width", type)) {
				width = (unsigned int) value;
			}
			if (!strcmp("height", type)) {
				height = (unsigned int) value;
			}
		} else {
			if ( sscanf(fline, "static unsigned char %s = {", iname) == 1
			  || sscanf(fline, "static char %s = {", iname) == 1)
			{
				max_bit = 128;
			} else if (sscanf(fline, "static unsigned short %s = {", iname) == 1
					|| sscanf(fline, "static short %s = {", iname) == 1)
			{
				max_bit = 32768;
			}
			if (max_bit) {
				bytes = (width * height / 8) + 1;
				if (!bytes) {
					return 0;
				}
				if (!(type = strrchr(iname, '_'))) {
					type = iname;
				} else {
					type++;
				}
				if (!strcmp("bits[]", type)) {
					break;
				}
			}
 		}
	}
	if (!bytes || !max_bit) {
		return 0;
	}

	if(!(im = gdImageCreate(width, height))) {
		return 0;
	}
	gdImageColorAllocate(im, 255, 255, 255);
	gdImageColorAllocate(im, 0, 0, 0);
	h[2] = '\0';
	h[4] = '\0';
	for (i = 0; i < bytes; i++) {
		while (1) {
			if ((ch=getc(fd)) == EOF) {
				fail = 1;
				break;
			}
			if (ch == 'x') {
				break;
			}
		}
		if (fail) {
			break;
		}
		/* Get hex value */
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[0] = ch;
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[1] = ch;
		if (max_bit == 32768) {
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[2] = ch;
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[3] = ch;
		}
		sscanf(h, "%x", &b);
		for (bit = 1; bit <= max_bit; bit = bit << 1) {
			gdImageSetPixel(im, x++, y, (b & bit) ? 1 : 0);
			if (x == im->sx) {
				x = 0;
				y++;
				if (y == im->sy) {
					return im;
				}
				break;
			}
		}
	}

	gd_error("EOF before image was complete");
	gdImageDestroy(im);
	return 0;
}